

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printRotImmOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  int iVar2;
  MCOperand *op;
  int64_t iVar3;
  uint Imm;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNum);
  iVar3 = MCOperand_getImm(op);
  iVar2 = (int)iVar3;
  if (iVar2 == 0) {
    return;
  }
  SStream_concat0(O,", ror #");
  if (iVar2 != 1) {
    if (iVar2 == 2) {
      SStream_concat0(O,anon_var_dwarf_46039 + 0x15);
      goto LAB_0019038c;
    }
    if (iVar2 == 3) {
      SStream_concat0(O,anon_var_dwarf_45f61 + 0x15);
      goto LAB_0019038c;
    }
  }
  SStream_concat0(O,anon_var_dwarf_4602d + 0x15);
LAB_0019038c:
  if (MI->csh->detail != CS_OPT_OFF) {
    puVar1 = MI->flat_insn->detail->groups +
             (long)(int)((MI->flat_insn->detail->field_6).arm.op_count - 1) * 0x28 + 0x3a;
    puVar1[0] = '\x04';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(int *)(MI->flat_insn->detail->groups +
            (long)(int)((MI->flat_insn->detail->field_6).arm.op_count - 1) * 0x28 + 0x3e) =
         iVar2 << 3;
  }
  return;
}

Assistant:

static void printRotImmOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned Imm = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	if (Imm == 0)
		return;
	SStream_concat0(O, ", ror #");
	switch (Imm) {
		default: //assert (0 && "illegal ror immediate!");
		case 1: SStream_concat0(O, "8"); break;
		case 2: SStream_concat0(O, "16"); break;
		case 3: SStream_concat0(O, "24"); break;
	}
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.type = ARM_SFT_ROR;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.value = Imm * 8;
	}
}